

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

istream * operator>>(istream *in,Matrix *matrix)

{
  Matrix *in_00;
  istream *this;
  Fraction *f;
  int local_48;
  int local_44;
  int j;
  int i;
  int local_20;
  int local_1c;
  int m;
  int n;
  Matrix *matrix_local;
  istream *in_local;
  
  _m = matrix;
  matrix_local = (Matrix *)in;
  this = (istream *)std::istream::operator>>((istream *)in,&local_1c);
  std::istream::operator>>(this,&local_20);
  Matrix::Matrix((Matrix *)&j,local_1c,local_20,0);
  Matrix::operator=(_m,(Matrix *)&j);
  Matrix::~Matrix((Matrix *)&j);
  for (local_44 = 0; local_44 < local_1c; local_44 = local_44 + 1) {
    for (local_48 = 0; in_00 = matrix_local, local_48 < local_20; local_48 = local_48 + 1) {
      f = Matrix::At(_m,local_44,local_48);
      operator>>((istream *)in_00,f);
    }
  }
  return (istream *)matrix_local;
}

Assistant:

std::istream& operator>>(std::istream& in, Matrix& matrix) {
  int n, m;
  in >> n >> m;

  matrix = Matrix(n, m);
  for (int i = 0; i < n; ++i) {
    for (int j = 0; j < m; ++j) {
      in >> matrix.At(i, j);
    }
  }

  return in;
}